

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.c
# Opt level: O3

input_t inputroutine_kempston(tgestate_t *state)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  
  bVar1 = (*state->speccy->in)(state->speccy,0x1f);
  iVar3 = 6;
  if ((bVar1 & 1) == 0) {
    iVar3 = 0;
  }
  iVar2 = 3;
  if ((bVar1 & 2) == 0) {
    iVar2 = iVar3;
  }
  bVar4 = 1;
  if ((bVar1 & 8) == 0) {
    bVar4 = bVar1 >> 1 & 2;
  }
  bVar1 = (bVar1 & 0x10) >> 4;
  return (uint)bVar1 + (uint)bVar1 * 8 + iVar2 + (uint)bVar4;
}

Assistant:

static input_t inputroutine_kempston(tgestate_t *state)
{
  uint8_t keybits;    /* was A */
  input_t left_right; /* was B */
  input_t up_down;    /* was C */
  int     carry = 0;  /* was flags */
  input_t fire;       /* was A */

  assert(state != NULL);

  keybits = state->speccy->in(state->speccy, 0x001F);

  left_right = up_down = 0;

  RR(keybits);
  if (carry)
    left_right = input_RIGHT;

  RR(keybits);
  if (carry)
    left_right = input_LEFT;

  RR(keybits);
  if (carry)
    up_down = input_DOWN;

  RR(keybits);
  if (carry)
    up_down = input_UP;

  RR(keybits);
  fire = input_FIRE;
  if (!carry)
    fire = 0;

  return fire + left_right + up_down; /* Combine axis */
}